

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvparser.cc
# Opt level: O2

long mkvparser::UnserializeFloat(IMkvReader *pReader,longlong pos,longlong size_,double *result)

{
  int iVar1;
  long lVar2;
  ulong uVar3;
  uint uVar4;
  double dVar5;
  uchar buf [8];
  
  lVar2 = -2;
  if ((-1 < pos && pReader != (IMkvReader *)0x0) && ((size_ == 8 || (size_ == 4)))) {
    iVar1 = (**pReader->_vptr_IMkvReader)(pReader,pos,size_);
    if (iVar1 < 0) {
      lVar2 = (long)iVar1;
    }
    else {
      if (size_ == 4) {
        uVar4 = 0;
        for (lVar2 = 0; lVar2 != 3; lVar2 = lVar2 + 1) {
          uVar4 = (buf[lVar2] | uVar4) << 8;
        }
        dVar5 = (double)(float)(buf[lVar2] | uVar4);
      }
      else {
        uVar3 = 0;
        for (lVar2 = 0; dVar5 = (double)(buf[lVar2] | uVar3), lVar2 != 7; lVar2 = lVar2 + 1) {
          uVar3 = (long)dVar5 << 8;
        }
      }
      *result = dVar5;
      if (ABS(dVar5) == INFINITY) {
        lVar2 = -2;
      }
      else {
        lVar2 = (ulong)(!NAN(dVar5) && !NAN(dVar5)) * 2 + -2;
      }
    }
  }
  return lVar2;
}

Assistant:

long UnserializeFloat(IMkvReader* pReader, long long pos, long long size_,
                      double& result) {
  if (!pReader || pos < 0 || ((size_ != 4) && (size_ != 8)))
    return E_FILE_FORMAT_INVALID;

  const long size = static_cast<long>(size_);

  unsigned char buf[8];

  const int status = pReader->Read(pos, size, buf);

  if (status < 0)  // error
    return status;

  if (size == 4) {
    union {
      float f;
      uint32_t ff;
      static_assert(sizeof(float) == sizeof(uint32_t), "");
    };

    ff = 0;

    for (int i = 0;;) {
      ff |= buf[i];

      if (++i >= 4)
        break;

      ff <<= 8;
    }

    result = f;
  } else {
    union {
      double d;
      uint64_t dd;
      static_assert(sizeof(double) == sizeof(uint64_t), "");
    };

    dd = 0;

    for (int i = 0;;) {
      dd |= buf[i];

      if (++i >= 8)
        break;

      dd <<= 8;
    }

    result = d;
  }

  if (mkvparser::isinf(result) || mkvparser::isnan(result))
    return E_FILE_FORMAT_INVALID;

  return 0;
}